

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::optional_caster<std::optional<kratos::EventControl>_>::load
          (optional_caster<std::optional<kratos::EventControl>_> *this,handle src,bool convert)

{
  uint64_t uVar1;
  Var *pVVar2;
  undefined8 uVar3;
  bool bVar4;
  itype *piVar5;
  undefined1 local_40 [8];
  value_conv inner_caster;
  
  if (src.m_ptr == (PyObject *)0x0) {
    bVar4 = false;
  }
  else if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    bVar4 = true;
  }
  else {
    type_caster_base<kratos::EventControl>::type_caster_base
              ((type_caster_base<kratos::EventControl> *)local_40);
    bVar4 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)local_40,src,convert);
    if (bVar4) {
      piVar5 = detail::type_caster_base::operator_cast_to_EventControl_
                         ((type_caster_base *)local_40);
      if ((this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
          super__Optional_payload_base<kratos::EventControl>._M_engaged == true) {
        (this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
        super__Optional_payload_base<kratos::EventControl>._M_engaged = false;
      }
      uVar1 = piVar5->delay;
      pVVar2 = piVar5->var;
      uVar3 = *(undefined8 *)&piVar5->delay_side;
      *(undefined8 *)
       ((long)&(this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
               super__Optional_payload_base<kratos::EventControl>._M_payload + 0x10) =
           *(undefined8 *)&piVar5->type;
      *(undefined8 *)
       ((long)&(this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
               super__Optional_payload_base<kratos::EventControl>._M_payload + 0x18) = uVar3;
      (this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_payload._M_value.delay = uVar1;
      (this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_payload._M_value.var = pVVar2;
      (this->value).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_engaged = true;
    }
  }
  return bVar4;
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) {
            return false;
        }
        if (src.is_none()) {
            return true;  // default-constructed value is already empty
        }
        value_conv inner_caster;
        if (!inner_caster.load(src, convert))
            return false;

        value.emplace(cast_op<typename T::value_type &&>(std::move(inner_caster)));
        return true;
    }